

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::Open(Benchmark *this)

{
  char *pcVar1;
  FILE *__stream;
  bool bVar2;
  undefined8 uVar3;
  Status local_c0 [4];
  allocator local_99;
  string local_98 [32];
  DB local_78;
  Status s;
  Options options;
  Benchmark *this_local;
  
  if (this->db_ != (DB *)0x0) {
    __assert_fail("db_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench.cc"
                  ,0x2b1,"void leveldb::Benchmark::Open()");
  }
  Options::Options((Options *)&s);
  pcVar1 = FLAGS_db;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar1,&local_99);
  DB::Open(&local_78,(Options *)&s,(string *)local_98,&this->db_);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  bVar2 = Status::ok((Status *)&local_78);
  __stream = _stderr;
  if (!bVar2) {
    Status::ToString_abi_cxx11_(local_c0);
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"open error: %s\n",uVar3);
    std::__cxx11::string::~string((string *)local_c0);
    exit(1);
  }
  Status::~Status((Status *)&local_78);
  return;
}

Assistant:

void Open() {
    assert(db_ == nullptr);
    Options options;
    options.env = g_env;
    options.create_if_missing = !FLAGS_use_existing_db;
    options.block_cache = cache_;
    options.write_buffer_size = FLAGS_write_buffer_size;
    options.max_file_size = FLAGS_max_file_size;
    options.block_size = FLAGS_block_size;
    options.max_open_files = FLAGS_open_files;
    options.filter_policy = filter_policy_;
    options.reuse_logs = FLAGS_reuse_logs;
    Status s = DB::Open(options, FLAGS_db, &db_);
    if (!s.ok()) {
      std::fprintf(stderr, "open error: %s\n", s.ToString().c_str());
      std::exit(1);
    }
  }